

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitmap256.cc
# Opt level: O3

int __thiscall duckdb_re2::Bitmap256::FindNextSetBit(Bitmap256 *this,int c)

{
  long lVar1;
  uint uVar2;
  ulong uVar3;
  int iVar4;
  
  iVar4 = c + 0x3f;
  if (-1 < c) {
    iVar4 = c;
  }
  iVar4 = iVar4 >> 6;
  uVar3 = (this->words_[iVar4] >> ((byte)c & 0x3f)) << ((byte)c & 0x3f);
  if (uVar3 == 0) {
    uVar2 = 0xffffffff;
    if (iVar4 != 2) {
      if (iVar4 != 1) {
        if (iVar4 != 0) {
          return -1;
        }
        uVar3 = this->words_[1];
        if (uVar3 != 0) {
          lVar1 = 0;
          if (uVar3 != 0) {
            for (; (uVar3 >> lVar1 & 1) == 0; lVar1 = lVar1 + 1) {
            }
          }
          return (uint)lVar1 | 0x40;
        }
      }
      uVar3 = this->words_[2];
      if (uVar3 != 0) {
        lVar1 = 0;
        if (uVar3 != 0) {
          for (; (uVar3 >> lVar1 & 1) == 0; lVar1 = lVar1 + 1) {
          }
        }
        return (uint)lVar1 | 0x80;
      }
    }
    uVar3 = this->words_[3];
    if (uVar3 != 0) {
      lVar1 = 0;
      if (uVar3 != 0) {
        for (; (uVar3 >> lVar1 & 1) == 0; lVar1 = lVar1 + 1) {
        }
      }
      return (uint)lVar1 | 0xc0;
    }
  }
  else {
    lVar1 = 0;
    if (uVar3 != 0) {
      for (; (uVar3 >> lVar1 & 1) == 0; lVar1 = lVar1 + 1) {
      }
    }
    uVar2 = (uint)lVar1 | iVar4 << 6;
  }
  return uVar2;
}

Assistant:

int Bitmap256::FindNextSetBit(int c) const {
  DCHECK_GE(c, 0);
  DCHECK_LE(c, 255);

  // Check the word that contains the bit. Mask out any lower bits.
  int i = c / 64;
  uint64_t word = words_[i] & (~uint64_t{0} << (c % 64));
  if (word != 0)
    return (i * 64) + FindLSBSet(word);

  // Check any following words.
  i++;
  switch (i) {
    case 1:
      if (words_[1] != 0)
        return (1 * 64) + FindLSBSet(words_[1]);
      FALLTHROUGH_INTENDED;
    case 2:
      if (words_[2] != 0)
        return (2 * 64) + FindLSBSet(words_[2]);
      FALLTHROUGH_INTENDED;
    case 3:
      if (words_[3] != 0)
        return (3 * 64) + FindLSBSet(words_[3]);
      FALLTHROUGH_INTENDED;
    default:
      return -1;
  }
}